

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall kj::PathPtr::startsWith(PathPtr *this,PathPtr prefix)

{
  String *pSVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t __n;
  bool bVar5;
  char *__s2;
  char *__s1;
  long lVar6;
  ulong uVar7;
  
  uVar7 = prefix.parts.size_;
  if ((this->parts).size_ < uVar7) {
LAB_00460ce1:
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if (uVar7 != 0) {
      pSVar1 = (this->parts).ptr;
      lVar6 = 8;
      do {
        lVar2 = *(long *)((long)&(pSVar1->content).ptr + lVar6);
        __n = lVar2 + (ulong)(lVar2 == 0);
        lVar3 = *(long *)((long)&((prefix.parts.ptr)->content).ptr + lVar6);
        if (__n != lVar3 + (ulong)(lVar3 == 0)) goto LAB_00460ce1;
        __s2 = "";
        if (lVar3 != 0) {
          __s2 = *(char **)((long)prefix.parts.ptr + lVar6 + -8);
        }
        __s1 = "";
        if (lVar2 != 0) {
          __s1 = *(char **)((long)pSVar1 + lVar6 + -8);
        }
        iVar4 = bcmp(__s1,__s2,__n);
        if (iVar4 != 0) goto LAB_00460ce1;
        lVar6 = lVar6 + 0x18;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  return bVar5;
}

Assistant:

bool PathPtr::startsWith(PathPtr prefix) const {
  return parts.size() >= prefix.parts.size() &&
         parts.first(prefix.parts.size()) == prefix.parts;
}